

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_FindReplace(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int nPats,
                    Vec_Int_t *vSupp)

{
  word *pwVar1;
  int Lit;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  word *pwVar6;
  ulong uVar7;
  uint nWords;
  int i;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  word Mask [256];
  word Covered [256];
  word Both [256];
  
  nWords = ((nPats >> 6) + 1) - (uint)((nPats & 0x3fU) == 0);
  if (0x100 < (int)nWords) {
    __assert_fail("nWords <= NWORDS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x44e,
                  "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  uVar8 = 0;
  Abc_TtConst(Mask,nWords,0);
  if (nPats < 1) {
    nPats = 0;
  }
  for (; nPats != uVar8; uVar8 = uVar8 + 1) {
    Mask[uVar8 >> 6] = Mask[uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
  }
  i = 0;
  uVar9 = 0;
  if (0 < (int)nWords) {
    uVar9 = (ulong)nWords;
  }
  do {
    if (vSupp->nSize <= i) {
      return;
    }
    Lit = Vec_IntEntry(vSupp,i);
    iVar2 = Abc_Lit2Var(Lit);
    Abc_TtConst(Covered,nWords,0);
    for (iVar10 = 0; iVar10 < vSupp->nSize; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(vSupp,iVar10);
      if (iVar3 != Lit) {
        iVar3 = Abc_Lit2Var(iVar3);
        pwVar6 = Vec_WrdEntryP(vPats,(iVar3 - iFirstDiv) * 0x100);
        Abc_TtOr(Covered,Covered,pwVar6,nWords);
      }
    }
    iVar2 = iVar2 - iFirstDiv;
    iVar3 = 0;
    iVar10 = 0;
    if (0 < iVar2) {
      iVar10 = iVar2;
    }
    for (; iVar3 != iVar10; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(vWeights,iVar3);
      iVar5 = Vec_IntEntry(vWeights,iVar2);
      if (iVar4 != iVar5) {
        iVar4 = Vec_IntEntry(vWeights,iVar3);
        iVar5 = Vec_IntEntry(vWeights,iVar2);
        if (iVar5 <= iVar4) {
          __assert_fail("Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                        ,0x465,
                        "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                       );
        }
        pwVar6 = Vec_WrdEntryP(vPats,iVar3 << 8);
        Abc_TtOr(Both,Covered,pwVar6,nWords);
        uVar7 = 0;
        do {
          if (uVar9 == uVar7) {
            iVar4 = Abc_Var2Lit(iVar3 + iFirstDiv,1);
            Vec_IntWriteEntry(vSupp,i,iVar4);
            iVar4 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + vSupp->nSize,0,0,0,0);
            if (iVar4 == -1) goto LAB_0032a1bc;
            Vec_IntWriteEntry(vSupp,i,Lit);
            break;
          }
          pwVar1 = Both + uVar7;
          pwVar6 = Mask + uVar7;
          uVar7 = uVar7 + 1;
        } while (*pwVar1 == *pwVar6);
      }
    }
LAB_0032a1bc:
    i = i + 1;
  } while( true );
}

Assistant:

void Acb_FindReplace( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int nPats, Vec_Int_t * vSupp )
{
    int i, k, iLit, iLit2, status, nWords = Abc_Bit6WordNum(nPats);
    word Covered[NWORDS], Both[NWORDS], Mask[NWORDS], * pMask; 
    assert( nWords <= NWORDS );
    // prepare constant pattern
    Abc_TtConst( Mask, nWords, 0 );
    for ( i = 0; i < nPats; i++ )
        Abc_TtSetBit( Mask, i );
    // try to replace each by a cheaper one
    Vec_IntForEachEntry( vSupp, iLit, i )
    {
        int iDiv = Abc_Lit2Var(iLit) - iFirstDiv;
        // collect covered except by this one
        Abc_TtConst( Covered, nWords, 0 );
        Vec_IntForEachEntry( vSupp, iLit2, k )
        {
            if ( iLit2 == iLit )
                continue;
            pMask = Vec_WrdEntryP( vPats, NWORDS*(Abc_Lit2Var(iLit2) - iFirstDiv) );
            Abc_TtOr( Covered, Covered, pMask, nWords );
        }
        // consider any cheaper ones that this one
        for ( k = 0; k < iDiv; k++ )
        {
            if ( Vec_IntEntry(vWeights, k) == Vec_IntEntry(vWeights, iDiv) )
                continue;
            assert( Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv) );
            pMask = Vec_WrdEntryP( vPats, NWORDS*k );
            // check if it covers the remaining ones
            Abc_TtOr( Both, Covered, pMask, nWords );
            if ( !Abc_TtEqual(Both, Mask, nWords) )
                continue;
            // try this one
            Vec_IntWriteEntry( vSupp, i, Abc_Var2Lit(iFirstDiv+k, 1) );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status == l_False ) // success
            {
                //printf( "Replacing %d(%d) by %d(%d) with const difference %d.\n",
                //    iDiv, Vec_IntEntry(vWeights, iDiv), k, Vec_IntEntry(vWeights, k), 
                //    Vec_IntEntry(vWeights, iDiv) - Vec_IntEntry(vWeights, k) );
                break;
            }
            Vec_IntWriteEntry( vSupp, i, iLit );
        }
    }
}